

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

format_arg * __thiscall
fmt::v6::internal::
get_arg<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
          (format_arg *__return_storage_ptr__,internal *this,
          basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>
          *ctx,int id)

{
  basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  ::get(__return_storage_ptr__,
        (basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
         *)(this + 8),(int)ctx);
  if (__return_storage_ptr__->type_ == none_type) {
    basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>::
    on_error((basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>
              *)this,"argument index out of range");
  }
  return __return_storage_ptr__;
}

Assistant:

FMT_CONSTEXPR typename Context::format_arg get_arg(Context& ctx, int id) {
  auto arg = ctx.arg(id);
  if (!arg) ctx.on_error("argument index out of range");
  return arg;
}